

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O3

QDataStream * QtPrivate::writeSequentialContainer<QList<QPointF>>(QDataStream *s,QList<QPointF> *c)

{
  ulong i;
  QDataStream *this;
  qint32 i_00;
  value_type *t;
  QPointF *p;
  long lVar1;
  
  i = (c->d).size;
  if (i >> 1 < 0x7fffffff) {
    i_00 = (qint32)i;
  }
  else {
    if (0x15 < s->ver) {
      this = QDataStream::operator<<(s,-2);
      QDataStream::operator<<(this,i);
      goto LAB_003e6d1a;
    }
    if (i != 0xfffffffe) {
      QDataStream::setStatus(s,SizeLimitExceeded);
      return s;
    }
    i_00 = -2;
  }
  QDataStream::operator<<(s,i_00);
LAB_003e6d1a:
  lVar1 = (c->d).size;
  if (lVar1 != 0) {
    p = (c->d).ptr;
    lVar1 = lVar1 << 4;
    do {
      ::operator<<(s,p);
      p = p + 1;
      lVar1 = lVar1 + -0x10;
    } while (lVar1 != 0);
  }
  return s;
}

Assistant:

QDataStream &writeSequentialContainer(QDataStream &s, const Container &c)
{
    if (!QDataStream::writeQSizeType(s, c.size()))
        return s;
    for (const typename Container::value_type &t : c)
        s << t;

    return s;
}